

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O2

void __thiscall
ScriptUtil_GetP2pkLockingScriptTest_Test::~ScriptUtil_GetP2pkLockingScriptTest_Test
          (ScriptUtil_GetP2pkLockingScriptTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptUtil, GetP2pkLockingScriptTest) {
  const std::vector<ScriptUtil_PubkeyTestVector> test_vectors = {
    {
      Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
      Script("2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0ac")
    },
    {
      Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
      Script("210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac")
    },
    {
      Pubkey("04fe53c78e36b86aae8082484a4007b706d5678cabb92d178fc95020d4d8dc41ef44cfbb8dfa7a593c7910a5b6f94d079061a7766cbeed73e24ee4f654f1e51904"),
      Script("4104fe53c78e36b86aae8082484a4007b706d5678cabb92d178fc95020d4d8dc41ef44cfbb8dfa7a593c7910a5b6f94d079061a7766cbeed73e24ee4f654f1e51904ac")
    },
  };

  Script actual;
  for (const ScriptUtil_PubkeyTestVector& test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2pkLockingScript(test_vector.input_pubkey)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
  }
}